

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O3

shared_ptr<vmips::CFGNode> __thiscall vmips::Function::entry(Function *this)

{
  size_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Function *in_RSI;
  shared_ptr<vmips::CFGNode> sVar1;
  undefined1 local_51;
  Function *local_50;
  string local_48;
  
  next_name_abi_cxx11_(&local_48,in_RSI);
  (this->name)._M_dataplus._M_p = (pointer)0x0;
  this_00 = &(this->name)._M_string_length;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<vmips::CFGNode,std::allocator<vmips::CFGNode>,vmips::Function*,std::__cxx11::string>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00,(CFGNode **)this,
             (allocator<vmips::CFGNode> *)&local_51,&local_50,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  std::vector<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>::
  push_back(&in_RSI->blocks,(value_type *)this);
  (in_RSI->cursor).super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(this->name)._M_dataplus._M_p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(in_RSI->cursor).super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
  sVar1.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<vmips::CFGNode>)
         sVar1.super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<CFGNode> Function::entry() {
    auto ret = std::make_shared<CFGNode>(this, next_name());
    blocks.push_back(ret);
    switch_to(ret);
    return ret;
}